

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ClassDef::Interface>::copyAppend
          (QGenericArrayOps<ClassDef::Interface> *this,Interface *b,Interface *e)

{
  Interface *pIVar1;
  Data *pDVar2;
  long lVar3;
  
  if ((b != e) && (b < e)) {
    pIVar1 = (this->super_QArrayDataPointer<ClassDef::Interface>).ptr;
    lVar3 = (this->super_QArrayDataPointer<ClassDef::Interface>).size;
    do {
      pDVar2 = (b->className).d.d;
      pIVar1[lVar3].className.d.d = pDVar2;
      pIVar1[lVar3].className.d.ptr = (b->className).d.ptr;
      pIVar1[lVar3].className.d.size = (b->className).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar2 = (b->interfaceId).d.d;
      pIVar1[lVar3].interfaceId.d.d = pDVar2;
      pIVar1[lVar3].interfaceId.d.ptr = (b->interfaceId).d.ptr;
      pIVar1[lVar3].interfaceId.d.size = (b->interfaceId).d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      b = b + 1;
      lVar3 = (this->super_QArrayDataPointer<ClassDef::Interface>).size + 1;
      (this->super_QArrayDataPointer<ClassDef::Interface>).size = lVar3;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }